

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexWriterBase::writeFaceBlock
          (PtexWriterBase *this,FILE *fp,void *data,int stride,Res res,FaceDataHeader *fdh)

{
  int iVar1;
  DataType dt;
  undefined8 uVar2;
  byte bVar3;
  FILE *fp_00;
  uint uVar4;
  undefined1 *dst;
  int uw;
  uint uVar5;
  FaceDataHeader **ppFVar6;
  undefined6 in_register_00000082;
  ulong uVar7;
  int size;
  ulong uVar8;
  FaceDataHeader *local_48;
  FILE *local_40;
  int local_38;
  uint local_34;
  
  ppFVar6 = &local_48;
  local_48 = fdh;
  uVar7 = CONCAT62(in_register_00000082,res) & 0xffffffff;
  local_40 = fp;
  bVar3 = (byte)(uVar7 >> 8);
  uw = 1 << (res.ulog2 & 0x1fU);
  uVar8 = (long)(uw << (bVar3 & 0x1f)) * (long)this->_pixelSize;
  size = (int)uVar8;
  if (size < 0x4001) {
    ppFVar6 = (FaceDataHeader **)((long)&local_48 - (uVar8 + 0xf & 0xfffffffffffffff0));
    dst = (undefined1 *)ppFVar6;
  }
  else {
    local_38 = stride;
    local_34 = (uint)CONCAT62(in_register_00000082,res);
    dst = (undefined1 *)operator_new__(uVar8 & 0xffffffff);
    uVar7 = (ulong)local_34;
    stride = local_38;
  }
  uVar8 = (ulong)(this->_header).datatype;
  iVar1 = *(int *)(DataSize(Ptex::v2_2::DataType)::sizes + uVar8 * 4);
  *(ulong *)((long)ppFVar6 + -8) = (ulong)(this->_header).nchannels;
  *(ulong *)((long)ppFVar6 + -0x10) = uVar8;
  *(undefined8 *)((long)ppFVar6 + -0x18) = 0x11d51c;
  PtexUtils::deinterleave
            (data,stride,uw,1 << (bVar3 & 0x1f),dst,iVar1 << ((byte)uVar7 & 0x1f),
             *(DataType *)((long)ppFVar6 + -0x10),*(int *)((long)ppFVar6 + -8));
  dt = (this->_header).datatype;
  uVar5 = 0x40000000;
  if (dt < dt_half) {
    *(undefined8 *)((long)ppFVar6 + -8) = 0x11d53c;
    PtexUtils::encodeDifference(dst,size,dt);
    uVar5 = 0x80000000;
  }
  *(undefined8 *)((long)ppFVar6 + -8) = 1;
  fp_00 = local_40;
  uVar2 = *(undefined8 *)((long)ppFVar6 + -8);
  *(undefined8 *)((long)ppFVar6 + -8) = 0x11d557;
  uVar4 = writeZipBlock(this,fp_00,dst,size,SUB81(uVar2,0));
  local_48->data = uVar4 & 0x3fffffff | uVar5;
  if (0x4000 < size) {
    *(undefined8 *)((long)ppFVar6 + -8) = 0x11d575;
    operator_delete__(dst);
  }
  return;
}

Assistant:

void PtexWriterBase::writeFaceBlock(FILE* fp, const void* data, int stride,
                                    Res res, FaceDataHeader& fdh)
{
    // write a single face data block
    // copy to temp buffer, and deinterleave
    int ures = res.u(), vres = res.v();
    int blockSize = ures*vres*_pixelSize;
    bool useNew = blockSize > AllocaMax;
    char* buff = useNew ? new char [blockSize] : (char*)alloca(blockSize);
    PtexUtils::deinterleave(data, stride, ures, vres, buff,
                            ures*DataSize(datatype()),
                            datatype(), _header.nchannels);

    // difference if needed
    bool diff = (datatype() == dt_uint8 ||
                 datatype() == dt_uint16);
    if (diff) PtexUtils::encodeDifference(buff, blockSize, datatype());

    // compress and stream data to file, and record size in header
    int zippedsize = writeZipBlock(fp, buff, blockSize);

    // record compressed size and encoding in data header
    fdh.set(zippedsize, diff ? enc_diffzipped : enc_zipped);
    if (useNew) delete [] buff;
}